

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall pybind11::gil_scoped_release::~gil_scoped_release(gil_scoped_release *this)

{
  internals *piVar1;
  
  if (this->tstate != (PyThreadState *)0x0) {
    PyEval_RestoreThread();
    if (this->disassoc == true) {
      piVar1 = detail::get_internals();
      PyThread_tss_set(piVar1->tstate,this->tstate);
    }
  }
  return;
}

Assistant:

~gil_scoped_release() {
        if (!tstate)
            return;
        PyEval_RestoreThread(tstate);
        if (disassoc) {
            auto key = detail::get_internals().tstate;
            PYBIND11_TLS_REPLACE_VALUE(key, tstate);
        }
    }